

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O3

void sha256_datasrc(char *buf,CVmDataSource *src,unsigned_long len)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  byte bVar12;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [16];
  sha256_ctx ctx;
  uchar hash [32];
  sha256_ctx local_4a0;
  ulong local_438 [129];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  local_4a0.count[0] = 0;
  local_4a0.count[1] = 0;
  local_4a0.hash[0] = 0x6a09e667;
  local_4a0.hash[1] = 0xbb67ae85;
  local_4a0.hash[2] = 0x3c6ef372;
  local_4a0.hash[3] = 0xa54ff53a;
  local_4a0.hash[4] = 0x510e527f;
  local_4a0.hash[5] = 0x9b05688c;
  local_4a0.hash[6] = 0x1f83d9ab;
  local_4a0.hash[7] = 0x5be0cd19;
  if (len != 0) {
    do {
      uVar7 = 0x400;
      if (len < 0x400) {
        uVar7 = len;
      }
      iVar5 = (*src->_vptr_CVmDataSource[3])(src,local_438,uVar7);
      if (iVar5 == 0) break;
      sha256_hash((uchar *)local_438,(long)iVar5,&local_4a0);
      len = len - (long)iVar5;
    } while (len != 0);
  }
  sha256_end((uchar *)local_438,&local_4a0);
  auVar4 = _DAT_002d56e0;
  auVar3 = _s_00000000_002d56c0;
  auVar2 = _DAT_002d56a0;
  lVar6 = 0;
  do {
    uVar7 = *(ulong *)((long)local_438 + lVar6);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar7;
    auVar10._0_2_ = (ushort)uVar7 >> 4;
    auVar10._2_2_ = (ushort)(uVar7 >> 0x10) >> 4;
    auVar10._4_2_ = (ushort)(uVar7 >> 0x20) >> 4;
    auVar10._6_2_ = (ushort)(uVar7 >> 0x34);
    auVar10._8_8_ = 0;
    auVar10 = auVar10 & auVar2;
    bVar12 = (byte)uVar7;
    bVar23 = (byte)(uVar7 >> 8);
    bVar24 = (byte)(uVar7 >> 0x10);
    bVar25 = (byte)(uVar7 >> 0x18);
    bVar26 = (byte)(uVar7 >> 0x20);
    bVar27 = (byte)(uVar7 >> 0x28);
    bVar28 = (byte)(uVar7 >> 0x30);
    bVar1 = (byte)(uVar7 >> 0x38);
    auVar13[0] = -((byte)((bVar12 < 0xa0) * -0x60 | (bVar12 >= 0xa0) * bVar12) == bVar12);
    auVar13[1] = -((byte)((bVar23 < 0xa0) * -0x60 | (bVar23 >= 0xa0) * bVar23) == bVar23);
    auVar13[2] = -((byte)((bVar24 < 0xa0) * -0x60 | (bVar24 >= 0xa0) * bVar24) == bVar24);
    auVar13[3] = -((byte)((bVar25 < 0xa0) * -0x60 | (bVar25 >= 0xa0) * bVar25) == bVar25);
    auVar13[4] = -((byte)((bVar26 < 0xa0) * -0x60 | (bVar26 >= 0xa0) * bVar26) == bVar26);
    auVar13[5] = -((byte)((bVar27 < 0xa0) * -0x60 | (bVar27 >= 0xa0) * bVar27) == bVar27);
    auVar13[6] = -((byte)((bVar28 < 0xa0) * -0x60 | (bVar28 >= 0xa0) * bVar28) == bVar28);
    auVar13[7] = -((byte)((bVar1 < 0xa0) * -0x60 | (bVar1 >= 0xa0) * bVar1) == bVar1);
    auVar13[8] = 0xff;
    auVar13[9] = 0xff;
    auVar13[10] = 0xff;
    auVar13[0xb] = 0xff;
    auVar13[0xc] = 0xff;
    auVar13[0xd] = 0xff;
    auVar13[0xe] = 0xff;
    auVar14[0] = auVar10[0] + '7';
    auVar14[1] = auVar10[1] + '7';
    auVar14[2] = auVar10[2] + '7';
    auVar14[3] = auVar10[3] + '7';
    auVar14[4] = auVar10[4] + '7';
    auVar14[5] = auVar10[5] + '7';
    auVar14[6] = auVar10[6] + '7';
    auVar14[7] = auVar10[7] + '7';
    auVar14[8] = auVar10[8];
    auVar14[9] = auVar10[9];
    auVar14[10] = auVar10[10];
    auVar14[0xb] = auVar10[0xb];
    auVar14[0xc] = auVar10[0xc];
    auVar14[0xd] = auVar10[0xd];
    auVar14[0xe] = auVar10[0xe];
    auVar14 = ~auVar13 & (auVar10._0_15_ | auVar3._0_15_) | auVar14 & auVar13;
    auVar8 = auVar8 & auVar4;
    auVar11[0] = -('\t' < auVar8[0]);
    auVar11[1] = -('\t' < auVar8[1]);
    auVar11[2] = -('\t' < auVar8[2]);
    auVar11[3] = -('\t' < auVar8[3]);
    auVar11[4] = -('\t' < auVar8[4]);
    auVar11[5] = -('\t' < auVar8[5]);
    auVar11[6] = -('\t' < auVar8[6]);
    auVar11[7] = -('\t' < auVar8[7]);
    auVar11[8] = -('\0' < auVar8[8]);
    auVar11[9] = -('\0' < auVar8[9]);
    auVar11[10] = -('\0' < auVar8[10]);
    auVar11[0xb] = -('\0' < auVar8[0xb]);
    auVar11[0xc] = -('\0' < auVar8[0xc]);
    auVar11[0xd] = -('\0' < auVar8[0xd]);
    auVar11[0xe] = -('\0' < auVar8[0xe]);
    auVar11[0xf] = -('\0' < auVar8[0xf]);
    auVar9[0] = auVar8[0] + '7';
    auVar9[1] = auVar8[1] + '7';
    auVar9[2] = auVar8[2] + '7';
    auVar9[3] = auVar8[3] + '7';
    auVar9[4] = auVar8[4] + '7';
    auVar9[5] = auVar8[5] + '7';
    auVar9[6] = auVar8[6] + '7';
    auVar9[7] = auVar8[7] + '7';
    auVar9[8] = auVar8[8];
    auVar9[9] = auVar8[9];
    auVar9[10] = auVar8[10];
    auVar9[0xb] = auVar8[0xb];
    auVar9[0xc] = auVar8[0xc];
    auVar9[0xd] = auVar8[0xd];
    auVar9[0xe] = auVar8[0xe];
    auVar9[0xf] = auVar8[0xf];
    auVar8 = ~auVar11 & (auVar8 | auVar3) | auVar9 & auVar11;
    auVar22._0_14_ = auVar14._0_14_;
    auVar22[0xe] = auVar14[7];
    auVar22[0xf] = auVar8[7];
    auVar21._14_2_ = auVar22._14_2_;
    auVar21._0_13_ = auVar14._0_13_;
    auVar21[0xd] = auVar8[6];
    auVar20._13_3_ = auVar21._13_3_;
    auVar20._0_12_ = auVar14._0_12_;
    auVar20[0xc] = auVar14[6];
    auVar19._12_4_ = auVar20._12_4_;
    auVar19._0_11_ = auVar14._0_11_;
    auVar19[0xb] = auVar8[5];
    auVar18._11_5_ = auVar19._11_5_;
    auVar18._0_10_ = auVar14._0_10_;
    auVar18[10] = auVar14[5];
    auVar17._10_6_ = auVar18._10_6_;
    auVar17._0_9_ = auVar14._0_9_;
    auVar17[9] = auVar8[4];
    auVar16._9_7_ = auVar17._9_7_;
    auVar16._0_8_ = auVar14._0_8_;
    auVar16[8] = auVar14[4];
    auVar15._8_8_ = auVar16._8_8_;
    auVar15[7] = auVar8[3];
    auVar15[6] = auVar14[3];
    auVar15[5] = auVar8[2];
    auVar15[4] = auVar14[2];
    auVar15[3] = auVar8[1];
    auVar15[2] = auVar14[1];
    auVar15[0] = auVar14[0];
    auVar15[1] = auVar8[0];
    *(undefined1 (*) [16])(buf + lVar6 * 2) = auVar15;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  buf[0x40] = '\0';
  return;
}

Assistant:

void sha256_datasrc(char *buf, CVmDataSource *src, unsigned long len)
{
    /* set up the hash accumulator */
    sha256_ctx ctx;
    sha256_begin(&ctx);

    /* feed the selected range of bytes into the hash */
    while (len != 0)
    {
        /* get a chunk up to one buffer-full, or the total remaining */
        unsigned char buf[1024];
        size_t cur = (len > sizeof(buf) ? sizeof(buf) : (size_t)len);

        /* read the chunk */
        if (cur != 0)
            cur = src->readc(buf, cur);

        /* if there's nothing left, we're done */
        if (cur == 0)
            break;

        /* feed this chunk into the hash */
        sha256_hash(buf, cur, &ctx);

        /* deduct this chunk from the remaining length */
        len -= cur;
    }

    /* calculate the hash result */
    const int HASH_BYTES = 32;
    unsigned char hash[HASH_BYTES];
    sha256_end(hash, &ctx);

    /* convert the binary hash to printable hex digits */
    char *bufp = buf;
    for (int i = 0 ; i < HASH_BYTES ; ++i, bufp += 2)
        byte_to_xdigits(bufp, hash[i]);

    /* null-terminate the string */
    *bufp = '\0';
}